

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O2

void __thiscall SCCLiveness::ExtendLifetime(SCCLiveness *this,Lifetime *lifetime,Instr *instr)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  StackSym *pSVar4;
  BasicBlock *this_00;
  Loop *pLVar5;
  code *pcVar6;
  uint uVar7;
  Lifetime *pLVar8;
  Instr *pIVar9;
  bool bVar10;
  BOOLEAN BVar11;
  uint uVar12;
  uint uVar13;
  uint32 uVar14;
  undefined4 *puVar15;
  Type *ppLVar16;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar17;
  Loop *pLVar18;
  Loop *buffer;
  uint32 uVar19;
  Iterator local_70;
  Lifetime *local_60;
  Instr *local_58;
  Lifetime *local_50;
  Lifetime *lifetime_local;
  Func *local_40;
  Loop *loop;
  
  local_50 = lifetime;
  loop = (Loop *)this;
  if (lifetime == (Lifetime *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar15 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                        ,0x2a7,"(lifetime != nullptr)","Lifetime not provided");
    if (!bVar10) goto LAB_005b18e1;
    *puVar15 = 0;
  }
  if (lifetime->sym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar15 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                        ,0x2a8,"(lifetime->sym != nullptr)","Lifetime has no symbol");
    if (!bVar10) goto LAB_005b18e1;
    *puVar15 = 0;
  }
  if (*(Loop **)loop->next != loop->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar15 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                        ,0x2a9,"(this->extendedLifetimesLoopList->Empty())",
                        "this->extendedLifetimesLoopList->Empty()");
    if (!bVar10) goto LAB_005b18e1;
    *puVar15 = 0;
  }
  pSVar4 = lifetime->sym;
  local_40 = loop->topFunc;
  uVar14 = lifetime->start;
  uVar19 = lifetime->end;
  lifetime_local._4_4_ = 0;
  local_60 = lifetime;
  local_58 = instr;
  for (; pIVar9 = local_58, pLVar8 = local_60, local_40 != (Func *)0x0;
      local_40 = (Func *)local_40->pinnedTypeRefs) {
    BVar11 = BVSparse<Memory::JitArenaAllocator>::Test
                       ((BVSparse<Memory::JitArenaAllocator> *)
                        (local_40->m_prologEncoder).cfiInstrOffset,(pSVar4->super_Sym).m_id);
    uVar12 = uVar19;
    if (BVar11 != '\0') {
      uVar1 = (local_40->m_prologEncoder).cfaWordOffset;
      uVar17 = extraout_RDX;
      uVar7 = uVar14;
      if (uVar1 < uVar14) {
        SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                  ((SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)loop->next,
                   (ArenaAllocator *)loop->headBlock,(Loop **)&local_40);
        uVar17 = extraout_RDX_00;
        uVar7 = uVar1;
      }
      uVar2 = *(uint *)&(local_40->m_prologEncoder).field_0xc4;
      if (uVar19 < uVar2) {
        uVar12 = uVar2;
      }
      lifetime_local._4_4_ = (uint)CONCAT71((int7)((ulong)uVar17 >> 8),1);
      bVar10 = uVar14 <= uVar1;
      uVar14 = uVar7;
      if ((bVar10) && (uVar19 < uVar2)) {
        SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                  ((SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)loop->next,
                   (ArenaAllocator *)loop->headBlock,(Loop **)&local_40);
        uVar12 = uVar2;
      }
    }
    uVar19 = uVar12;
  }
  if ((lifetime_local._4_4_ & 1) == 0) {
    uVar12 = local_60->end;
    uVar14 = IR::Instr::GetNumber(local_58);
    if (uVar12 < uVar14) {
      uVar14 = IR::Instr::GetNumber(pIVar9);
      pLVar8->end = uVar14;
      iVar3 = *(int *)&loop->float64SymsOnEntry;
      uVar13 = CurrentOpHelperVisitedLength((SCCLiveness *)loop,pIVar9);
      pLVar8->totalOpHelperLengthByEnd = uVar13 + iVar3;
    }
    goto LAB_005b18a0;
  }
  if (uVar14 < local_60->start) {
    local_60->start = uVar14;
    if (local_60->end < uVar19) {
LAB_005b1768:
      local_60->end = uVar19;
    }
    pLVar18 = loop->next;
    local_70.list = (SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)pLVar18;
    local_70.current = (NodeBase *)pLVar18;
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while( true ) {
      if (pLVar18 == (Loop *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                            ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar10) goto LAB_005b18e1;
        *puVar15 = 0;
        pLVar18 = (Loop *)local_70.current;
      }
      if (*(Loop **)pLVar18 == (Loop *)local_70.list) break;
      local_70.current = (NodeBase *)*(Loop **)pLVar18;
      ppLVar16 = SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_70);
      SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                (((*ppLVar16)->regAlloc).extendedLifetime,&local_50);
      pLVar18 = (Loop *)local_70.current;
    }
  }
  else if (local_60->end < uVar19) goto LAB_005b1768;
  pIVar9 = local_58;
  bVar10 = IR::Instr::HasLazyBailOut(local_58);
  if (((bVar10) || (uVar12 = local_50->end, uVar14 = IR::Instr::GetNumber(pIVar9), uVar12 <= uVar14)
      ) && ((bVar10 = IR::Instr::HasLazyBailOut(pIVar9), !bVar10 ||
            (uVar12 = local_50->end, uVar14 = IR::Instr::GetNumber(pIVar9), uVar12 < uVar14)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar15 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                        ,0x2f9,
                        "((!instr->HasLazyBailOut() && lifetime->end > instr->GetNumber()) || (instr->HasLazyBailOut() && lifetime->end >= instr->GetNumber()))"
                        ,"Lifetime end not set correctly");
    if (!bVar10) {
LAB_005b18e1:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar15 = 0;
  }
LAB_005b18a0:
  this_00 = loop->headBlock;
  pLVar18 = loop->next;
  buffer = *(Loop **)pLVar18;
  while (buffer != pLVar18) {
    pLVar5 = *(Loop **)buffer;
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,buffer,
               0x10);
    buffer = pLVar5;
  }
  *(Loop **)pLVar18 = pLVar18;
  *(undefined4 *)&pLVar18->headBlock = 0;
  return;
}

Assistant:

void
SCCLiveness::ExtendLifetime(Lifetime *lifetime, IR::Instr *instr)
{
    AssertMsg(lifetime != nullptr, "Lifetime not provided");
    AssertMsg(lifetime->sym != nullptr, "Lifetime has no symbol");
    Assert(this->extendedLifetimesLoopList->Empty());

    // Find the loop that we need to extend the lifetime to
    StackSym * sym = lifetime->sym;
    Loop * loop = this->curLoop;
    uint32 extendedLifetimeStart = lifetime->start;
    uint32 extendedLifetimeEnd = lifetime->end;
    bool isLiveOnBackEdge = false;
    bool loopAddedToList = false;

    while (loop)
    {
        if (loop->regAlloc.liveOnBackEdgeSyms->Test(sym->m_id))
        {
            isLiveOnBackEdge = true;
            if (loop->regAlloc.loopStart < extendedLifetimeStart)
            {
                extendedLifetimeStart = loop->regAlloc.loopStart;
                this->extendedLifetimesLoopList->Prepend(this->tempAlloc, loop);
                loopAddedToList = true;
            }
            if (loop->regAlloc.loopEnd > extendedLifetimeEnd)
            {
                extendedLifetimeEnd = loop->regAlloc.loopEnd;
                if (!loopAddedToList)
                {
                    this->extendedLifetimesLoopList->Prepend(this->tempAlloc, loop);
                }
            }
        }
        loop = loop->parent;
        loopAddedToList = false;
    }

    if (!isLiveOnBackEdge)
    {
        // Don't extend lifetime to loop boundary if the use are not live on back edge
        // Note: the above loop doesn't detect a reg that is live on an outer back edge
        // but not an inner one, so we can't assume here that the lifetime hasn't been extended
        // past the current instruction.
        if (lifetime->end < instr->GetNumber())
        {
            lifetime->end = instr->GetNumber();
            lifetime->totalOpHelperLengthByEnd = this->totalOpHelperFullVisitedLength + CurrentOpHelperVisitedLength(instr);
        }
    }
    else
    {
        // extend lifetime to the outer most loop boundary that have the symbol live on back edge.
        bool isLifetimeExtended = false;
        if (lifetime->start > extendedLifetimeStart)
        {
            isLifetimeExtended = true;
            lifetime->start = extendedLifetimeStart;
        }

        if (lifetime->end < extendedLifetimeEnd)
        {
            isLifetimeExtended = true;
            lifetime->end = extendedLifetimeEnd;
            // The total op helper length by the end of this lifetime will be updated once we reach the loop tail
        }

        if (isLifetimeExtended)
        {
            // Keep track of the lifetime extended for this loop so we can update the call bits
            FOREACH_SLISTBASE_ENTRY(Loop *, currLoop, this->extendedLifetimesLoopList)
            {
                currLoop->regAlloc.extendedLifetime->Prepend(lifetime);
            }
            NEXT_SLISTBASE_ENTRY
        }
#if _M_ARM64
        // The case of equality is valid on Arm64 where some branch instructions have sources.
        AssertMsg(lifetime->end >= instr->GetNumber(), "Lifetime end not set correctly");
#else
        AssertMsg(
            (!instr->HasLazyBailOut() && lifetime->end > instr->GetNumber()) ||
            (instr->HasLazyBailOut() && lifetime->end >= instr->GetNumber()),
            "Lifetime end not set correctly"
        );
#endif
    }
    this->extendedLifetimesLoopList->Clear(this->tempAlloc);
}